

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

Resource res_getTableItemByIndex_63(ResourceData *pResData,Resource table,int32_t indexR,char **key)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int32_t *piVar4;
  uint16_t *puVar5;
  long lVar6;
  Resource RVar7;
  uint uVar8;
  char *pcVar9;
  int32_t *piVar10;
  uint uVar11;
  
  RVar7 = 0xffffffff;
  if (-1 < indexR) {
    uVar11 = table & 0xfffffff;
    uVar8 = table >> 0x1c;
    if (uVar8 == 5) {
      puVar5 = pResData->p16BitUnits;
      uVar1 = puVar5[uVar11];
      if ((uint)indexR < (uint)uVar1) {
        if (key != (char **)0x0) {
          uVar2 = puVar5[(ulong)uVar11 + (ulong)(uint)indexR + 1];
          if ((int)(uint)uVar2 < pResData->localKeyLimit) {
            pcVar9 = (char *)((ulong)uVar2 + (long)pResData->pRoot);
          }
          else {
            pcVar9 = pResData->poolBundleKeys + ((ulong)uVar2 - (long)pResData->localKeyLimit);
          }
          *key = pcVar9;
        }
        uVar1 = puVar5[(ulong)uVar11 + (ulong)((uint)uVar1 + indexR) + 1];
        uVar8 = (uint)uVar1;
        if (pResData->poolStringIndex16Limit <= (int)(uint)uVar1) {
          uVar8 = ((uint)uVar1 - pResData->poolStringIndex16Limit) + pResData->poolStringIndexLimit;
        }
        return uVar8 | 0x60000000;
      }
    }
    else if (uVar8 == 4) {
      if (uVar11 != 0) {
        piVar4 = pResData->pRoot;
        iVar3 = piVar4[uVar11];
        if (indexR < iVar3) {
          if (key != (char **)0x0) {
            uVar8 = piVar4[(ulong)uVar11 + (ulong)(uint)indexR + 1];
            piVar10 = piVar4;
            if ((int)uVar8 < 0) {
              piVar10 = (int32_t *)pResData->poolBundleKeys;
              uVar8 = uVar8 & 0x7fffffff;
            }
            *key = (char *)((ulong)uVar8 + (long)piVar10);
          }
          RVar7 = piVar4[(ulong)uVar11 + (ulong)(uint)(iVar3 + indexR) + 1];
        }
      }
    }
    else if ((uVar8 == 2) && (uVar11 != 0)) {
      piVar4 = pResData->pRoot;
      uVar1 = *(ushort *)(piVar4 + uVar11);
      if ((uint)indexR < (uint)uVar1) {
        lVar6 = (ulong)uVar11 * 4 + 2;
        if (key != (char **)0x0) {
          uVar2 = *(ushort *)((long)piVar4 + (ulong)(uint)indexR * 2 + lVar6);
          if ((int)(uint)uVar2 < pResData->localKeyLimit) {
            pcVar9 = (char *)((long)piVar4 + (ulong)uVar2);
          }
          else {
            pcVar9 = pResData->poolBundleKeys + ((ulong)uVar2 - (long)pResData->localKeyLimit);
          }
          *key = pcVar9;
        }
        return *(Resource *)
                ((long)piVar4 +
                (ulong)(uint)indexR * 4 +
                (ulong)(~(uint)uVar1 & 1) * 2 + (ulong)(uint)uVar1 * 2 + lVar6);
      }
    }
  }
  return RVar7;
}

Assistant:

U_CAPI Resource U_EXPORT2
res_getTableItemByIndex(const ResourceData *pResData, Resource table,
                        int32_t indexR, const char **key) {
    uint32_t offset=RES_GET_OFFSET(table);
    int32_t length;
    if (indexR < 0) {
        return RES_BOGUS;
    }
    switch(RES_GET_TYPE(table)) {
    case URES_TABLE: {
        if (offset != 0) { /* empty if offset==0 */
            const uint16_t *p= (const uint16_t *)(pResData->pRoot+offset);
            length=*p++;
            if(indexR<length) {
                const Resource *p32=(const Resource *)(p+length+(~length&1));
                if(key!=NULL) {
                    *key=RES_GET_KEY16(pResData, p[indexR]);
                }
                return p32[indexR];
            }
        }
        break;
    }
    case URES_TABLE16: {
        const uint16_t *p=pResData->p16BitUnits+offset;
        length=*p++;
        if(indexR<length) {
            if(key!=NULL) {
                *key=RES_GET_KEY16(pResData, p[indexR]);
            }
            return makeResourceFrom16(pResData, p[length+indexR]);
        }
        break;
    }
    case URES_TABLE32: {
        if (offset != 0) { /* empty if offset==0 */
            const int32_t *p= pResData->pRoot+offset;
            length=*p++;
            if(indexR<length) {
                if(key!=NULL) {
                    *key=RES_GET_KEY32(pResData, p[indexR]);
                }
                return (Resource)p[length+indexR];
            }
        }
        break;
    }
    default:
        break;
    }
    return RES_BOGUS;
}